

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O3

void __thiscall
msdfgen::EdgeSegment::distanceToPseudoDistance
          (EdgeSegment *this,SignedDistance *distance,Point2 origin,double param)

{
  double extraout_XMM0_Qa;
  double dVar1;
  double extraout_XMM0_Qa_00;
  Vector2 aq;
  Vector2 dir;
  Vector2 local_60;
  Vector2 local_50;
  Vector2 local_40;
  Vector2 local_30;
  
  dVar1 = origin.y;
  local_40.x = origin.x;
  local_40.y = dVar1;
  if (0.0 <= param) {
    if (param <= 1.0) {
      return;
    }
    (*this->_vptr_EdgeSegment[4])(0x3ff0000000000000,this);
    local_60.y = dVar1;
    local_60.x = extraout_XMM0_Qa_00;
    local_50 = Vector2::normalize(&local_60,false);
    dVar1 = local_50.y;
    (*this->_vptr_EdgeSegment[3])(0x3ff0000000000000,this);
    local_30.y = dVar1;
    local_60 = Vector2::operator-(&local_40,&local_30);
    dVar1 = dotProduct(&local_60,&local_50);
    if (dVar1 <= 0.0) {
      return;
    }
  }
  else {
    (*this->_vptr_EdgeSegment[4])(this);
    local_60.y = dVar1;
    local_60.x = extraout_XMM0_Qa;
    local_50 = Vector2::normalize(&local_60,false);
    dVar1 = local_50.y;
    (*this->_vptr_EdgeSegment[3])(0,this);
    local_30.y = dVar1;
    local_60 = Vector2::operator-(&local_40,&local_30);
    dVar1 = dotProduct(&local_60,&local_50);
    if (0.0 <= dVar1) {
      return;
    }
  }
  dVar1 = crossProduct(&local_60,&local_50);
  if (ABS(dVar1) <= ABS(distance->distance)) {
    distance->distance = dVar1;
    distance->dot = 0.0;
  }
  return;
}

Assistant:

void EdgeSegment::distanceToPseudoDistance(SignedDistance &distance, Point2 origin, double param) const {
    if (param < 0) {
        Vector2 dir = direction(0).normalize();
        Vector2 aq = origin-point(0);
        double ts = dotProduct(aq, dir);
        if (ts < 0) {
            double pseudoDistance = crossProduct(aq, dir);
            if (fabs(pseudoDistance) <= fabs(distance.distance)) {
                distance.distance = pseudoDistance;
                distance.dot = 0;
            }
        }
    } else if (param > 1) {
        Vector2 dir = direction(1).normalize();
        Vector2 bq = origin-point(1);
        double ts = dotProduct(bq, dir);
        if (ts > 0) {
            double pseudoDistance = crossProduct(bq, dir);
            if (fabs(pseudoDistance) <= fabs(distance.distance)) {
                distance.distance = pseudoDistance;
                distance.dot = 0;
            }
        }
    }
}